

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O0

int close_input(void)

{
  int local_c;
  
  if (proc_ptr == (t_proc *)0x0) {
    if (in_macro == 0) {
      if (input_file[infile_num].if_level == if_level) {
        if (infile_num < 2) {
          local_c = -1;
        }
        else {
          fclose((FILE *)in_fp);
          infile_num = infile_num - 1;
          infile_error = -1;
          slnum = input_file[infile_num].lnum;
          in_fp = input_file[infile_num].fp;
          if (((pass == 1) && (xlist != 0)) && (list_level != 0)) {
            fprintf((FILE *)lst_fp,"#[%i]   %s\n",(ulong)(uint)infile_num,
                    (long)infile_num * 0x88 + 0x123d70);
          }
          local_c = 0;
        }
      }
      else {
        fatal_error("Incomplete IF/ENDIF statement!");
        local_c = -1;
      }
    }
    else {
      fatal_error("Incomplete MACRO definition!");
      local_c = -1;
    }
  }
  else {
    fatal_error("Incomplete PROC!");
    local_c = -1;
  }
  return local_c;
}

Assistant:

int
close_input(void)
{
	if (proc_ptr) {
		fatal_error("Incomplete PROC!");
		return (-1);
	}
	if (in_macro) {
		fatal_error("Incomplete MACRO definition!");
		return (-1);
	}
	if (input_file[infile_num].if_level != if_level) {
		fatal_error("Incomplete IF/ENDIF statement!");
		return (-1);
	}
	if (infile_num <= 1)
		return (-1);

	fclose(in_fp);
	infile_num--;
	infile_error = -1;
	slnum = input_file[infile_num].lnum;
	in_fp = input_file[infile_num].fp;
	if ((pass == LAST_PASS) && (xlist) && (list_level))
		fprintf(lst_fp, "#[%i]   %s\n", infile_num, input_file[infile_num].name);

	/* ok */
	return (0);
}